

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswPairs.c
# Opt level: O3

int Ssw_SecGeneral(Aig_Man_t *pAig1,Aig_Man_t *pAig2,Ssw_Pars_t *pPars)

{
  int iVar1;
  int iVar2;
  Aig_Man_t *pAVar3;
  Aig_Man_t *p;
  long lVar4;
  long lVar5;
  char *format;
  int level;
  timespec ts;
  timespec local_40;
  
  iVar2 = 3;
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  Abc_Print(iVar2,"Performing general verification without node pairs.\n");
  pAVar3 = Saig_ManCreateMiter(pAig1,pAig2,0);
  Aig_ManCleanup(pAVar3);
  p = Ssw_SignalCorrespondence(pAVar3,pPars);
  Aig_ManStop(pAVar3);
  pAVar3 = p;
  iVar1 = Ssw_MiterStatus(p,1);
  iVar2 = (int)pAVar3;
  if (iVar1 == 0) {
    format = "Verification failed with a counter-example.  ";
  }
  else {
    if (iVar1 != 1) {
      Abc_Print(iVar2,"Verification UNDECIDED. The number of remaining regs = %d (total = %d).  ",
                (ulong)(uint)p->nRegs,(ulong)(uint)(pAig2->nRegs + pAig1->nRegs));
      goto LAB_006b3064;
    }
    format = "Verification successful.  ";
  }
  Abc_Print(iVar2,format);
LAB_006b3064:
  Abc_Print(iVar2,"%s =","Time");
  level = 3;
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    lVar5 = -1;
  }
  else {
    lVar5 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  Abc_Print(level,"%9.2f sec\n",(double)(lVar5 + lVar4) / 1000000.0);
  Aig_ManStop(p);
  return iVar1;
}

Assistant:

int Ssw_SecGeneral( Aig_Man_t * pAig1, Aig_Man_t * pAig2, Ssw_Pars_t * pPars )
{
    Aig_Man_t * pAigRes, * pMiter;
    int RetValue;
    abctime clk = Abc_Clock();
    // try the new AIGs
    Abc_Print( 1, "Performing general verification without node pairs.\n" );
    pMiter = Saig_ManCreateMiter( pAig1, pAig2, 0 );
    Aig_ManCleanup( pMiter );
    pAigRes = Ssw_SignalCorrespondence( pMiter, pPars );
    Aig_ManStop( pMiter );
    // report the results
    RetValue = Ssw_MiterStatus( pAigRes, 1 );
    if ( RetValue == 1 )
        Abc_Print( 1, "Verification successful.  " );
    else if ( RetValue == 0 )
        Abc_Print( 1, "Verification failed with a counter-example.  " );
    else
        Abc_Print( 1, "Verification UNDECIDED. The number of remaining regs = %d (total = %d).  ",
            Aig_ManRegNum(pAigRes), Aig_ManRegNum(pAig1) + Aig_ManRegNum(pAig2) );
    ABC_PRT( "Time", Abc_Clock() - clk );
    // cleanup
    Aig_ManStop( pAigRes );
    return RetValue;
}